

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O1

int __thiscall AC3Codec::decodeFrame(AC3Codec *this,uint8_t *buf,uint8_t *end,int *skipBytes)

{
  uint uVar1;
  bool bVar2;
  AC3ParseError AVar3;
  long lVar4;
  uint8_t *extraout_RDX;
  uint8_t *extraout_RDX_00;
  uint8_t *puVar5;
  uint8_t *extraout_RDX_01;
  AC3ParseError unaff_EBP;
  uint8_t *buffer;
  ulong uVar6;
  int iVar7;
  byte *buf_00;
  
  if ((long)end - (long)buf < 2) {
    return -10;
  }
  puVar5 = end;
  if ((((this->m_state != stateDecodeAC3) && (*buf == '\v')) && (buf[1] == 'w')) &&
     (AVar3 = testParseHeader(this,buf,end), puVar5 = extraout_RDX, AVar3 == NO_ERROR)) {
    this->m_state = stateDecodeAC3;
  }
  if (this->m_state == stateDecodeAC3) {
    *skipBytes = 0;
    unaff_EBP = parseHeader(this,buf,end);
    puVar5 = extraout_RDX_00;
    if (unaff_EBP == NOT_ENOUGH_BUFFER) {
      bVar2 = false;
      iVar7 = 0;
    }
    else if (unaff_EBP == NO_ERROR) {
      lVar4 = (long)this->m_samples * 0x13b6d8300;
      puVar5 = (uint8_t *)(lVar4 % (long)this->m_sample_rate);
      this->m_frameDuration = lVar4 / (long)this->m_sample_rate;
      iVar7 = this->m_frame_size;
      bVar2 = true;
    }
    else {
      bVar2 = false;
      iVar7 = 0;
      unaff_EBP = NO_ERROR;
    }
    if (!bVar2) {
      return unaff_EBP;
    }
  }
  else {
    iVar7 = 0;
  }
  if ((this->m_testMode != true) || (this->m_true_hd_mode != false)) goto LAB_00176134;
  buffer = buf + iVar7;
  if ((long)end - (long)buffer < 8) {
LAB_001760e7:
    bVar2 = false;
    unaff_EBP = NOT_ENOUGH_BUFFER;
  }
  else if (((*buffer == '\v') && (buffer[1] == 'w')) ||
          ((buffer[4] != 0xf8 || ((buffer[5] != 'r' || (buffer[6] != 'o')))))) {
    bVar2 = true;
  }
  else {
    if ((long)end - (long)buffer < 0x15) goto LAB_001760e7;
    bVar2 = MLPCodec::decodeFrame(&this->mlp,buffer,buffer + 0x15);
    this->m_true_hd_mode = bVar2;
    bVar2 = true;
    puVar5 = extraout_RDX_01;
  }
  if (!bVar2) {
    return unaff_EBP;
  }
LAB_00176134:
  if (this->m_true_hd_mode != true) {
    if (this->m_downconvertToAC3 != true) {
      return iVar7;
    }
    if (10 < this->m_bsid) {
      *skipBytes = iVar7;
      return 0;
    }
    return iVar7;
  }
  buf_00 = buf + iVar7;
  if (6 < (long)end - (long)buf_00) {
    if (this->m_state == stateDecodeAC3) {
      if (((*buf_00 == 0xb) && (buf_00[1] == 0x77)) &&
         (AVar3 = testParseHeader(this,buf_00,puVar5), AVar3 == NO_ERROR)) {
        return iVar7;
      }
      this->m_waitMoreData = true;
      this->m_state = stateDecodeTrueHDFirst;
      return iVar7;
    }
    this->m_state = stateDecodeTrueHD;
    uVar1 = (*buf_00 & 0xf) * 0x200 + (uint)buf_00[1] * 2;
    uVar6 = (ulong)uVar1;
    if ((long)uVar6 <= (long)end - (long)buf_00) {
      if (((buf_00[uVar6] == 0xb) && ((buf_00 + uVar6)[1] == 0x77)) &&
         (AVar3 = testParseHeader(this,buf_00 + uVar6,puVar5), AVar3 == NO_ERROR)) {
        this->m_waitMoreData = false;
      }
      if (this->m_downconvertToAC3 == true) {
        *skipBytes = uVar1;
        return 0;
      }
      return uVar1;
    }
  }
  return -10;
}

Assistant:

int AC3Codec::decodeFrame(uint8_t *buf, uint8_t *end, int &skipBytes)
{
    try
    {
        int rez = 0;

        if (end - buf < 2)
            return NOT_ENOUGH_BUFFER;
        if (m_state != AC3State::stateDecodeAC3 && buf[0] == 0x0B && buf[1] == 0x77)
        {
            if (testDecodeTestFrame(buf, end))
                m_state = AC3State::stateDecodeAC3;
        }

        if (m_state == AC3State::stateDecodeAC3)
        {
            skipBytes = 0;
            const AC3ParseError err = parseHeader(buf, end);

            if (err == AC3ParseError::NOT_ENOUGH_BUFFER)
                return NOT_ENOUGH_BUFFER;

            if (err != AC3ParseError::NO_ERROR)
                return 0;  // parse error

            m_frameDuration = (INTERNAL_PTS_FREQ * m_samples) / m_sample_rate;
            rez = m_frame_size;
        }

        if (getTestMode() && !m_true_hd_mode)
        {
            uint8_t *trueHDData = buf + rez;
            if (end - trueHDData < 8)
                return NOT_ENOUGH_BUFFER;
            if (!isSyncWord(trueHDData) && isHDSyncWord(trueHDData + 4))
            {
                if (end - trueHDData < 21)
                    return NOT_ENOUGH_BUFFER;
                m_true_hd_mode = mlp.decodeFrame(trueHDData, trueHDData + 21);
            }
        }

        if ((m_true_hd_mode))  // omit AC3+
        {
            uint8_t *trueHDData = buf + rez;
            if (end - trueHDData < 7)
                return NOT_ENOUGH_BUFFER;
            if (m_state == AC3State::stateDecodeAC3)
            {
                // check if it is a real HD frame

                if (trueHDData[0] != 0x0B || trueHDData[1] != 0x77 || !testDecodeTestFrame(trueHDData, end))
                {
                    m_waitMoreData = true;
                    m_state = AC3State::stateDecodeTrueHDFirst;
                }
                return rez;
            }
            m_state = AC3State::stateDecodeTrueHD;
            int trueHDFrameLen = (trueHDData[0] & 0x0f) << 8;
            trueHDFrameLen += trueHDData[1];
            trueHDFrameLen *= 2;
            if (end - trueHDData < static_cast<int64_t>(trueHDFrameLen))
                return NOT_ENOUGH_BUFFER;
            if (!m_true_hd_mode)
            {
                m_true_hd_mode = mlp.decodeFrame(trueHDData, trueHDData + trueHDFrameLen);
            }
            uint8_t *nextFrame = trueHDData + trueHDFrameLen;

            if (nextFrame[0] == 0x0B && nextFrame[1] == 0x77 && testDecodeTestFrame(nextFrame, end))
                m_waitMoreData = false;

            if (m_downconvertToAC3)
            {
                skipBytes = trueHDFrameLen;
                return 0;
            }
            return trueHDFrameLen;
        }
        if (m_downconvertToAC3 && m_bsid > 10)
        {
            skipBytes = rez;  // skip E-AC3 frame
            return 0;
        }
        return rez;
    }
    catch (BitStreamException &)
    {
        return NOT_ENOUGH_BUFFER;
    }
}